

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::TableRef::Deserialize(TableRef *this,Deserializer *deserializer)

{
  undefined8 uVar1;
  undefined1 auVar2 [8];
  TableReferenceType TVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  _func_int **pp_Var6;
  pointer pTVar7;
  SerializationException *this_00;
  pointer *__ptr;
  _func_int **pp_Var8;
  string str;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> sample;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> alias;
  undefined1 local_70 [32];
  undefined1 local_50 [8];
  undefined8 local_48;
  tuple<duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_> local_40;
  undefined1 local_38 [9];
  undefined4 local_2f;
  undefined2 local_2b;
  char local_29;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_70,deserializer);
    TVar3 = EnumUtil::FromString<duckdb::TableReferenceType>((char *)local_70._0_8_);
    uVar4 = (uint)TVar3;
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_);
    }
  }
  else {
    uVar4 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"alias");
  if ((char)iVar5 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_70[0x10] = '\0';
    local_48 = local_38;
    local_38[0] = 0;
    local_38._1_8_ = local_70._17_8_;
    local_2f = local_70._25_4_;
    local_2b = local_70._29_2_;
    local_29 = local_70[0x1f];
    local_40.
    super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
    super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>)
         (_Head_base<0UL,_duckdb::SampleOptions_*,_false>)0x0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_48,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>>
            ((Deserializer *)local_50,(field_id_t)deserializer,(char *)0x66);
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"query_location");
  if ((char)iVar5 == '\0') {
    pp_Var8 = (_func_int **)0xffffffffffffffff;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    if (CONCAT44(extraout_var,iVar5) == 0xffffffffffffffff) {
      local_70._0_8_ = (_func_int **)0xffffffffffffffff;
    }
    else {
      optional_idx::optional_idx((optional_idx *)local_70,CONCAT44(extraout_var,iVar5));
    }
    pp_Var8 = (_func_int **)local_70._0_8_;
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this->_vptr_TableRef = (_func_int **)0x0;
  switch(uVar4 & 0xff) {
  case 1:
    BaseTableRef::Deserialize((BaseTableRef *)local_70,deserializer);
    break;
  case 2:
    SubqueryRef::Deserialize((SubqueryRef *)local_70,deserializer);
    break;
  case 3:
    JoinRef::Deserialize((JoinRef *)local_70,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_70._0_8_ = local_70 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Unsupported type for deserialization of TableRef!","");
    SerializationException::SerializationException(this_00,(string *)local_70);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case 5:
    TableFunctionRef::Deserialize((TableFunctionRef *)local_70,deserializer);
    break;
  case 6:
    ExpressionListRef::Deserialize((ExpressionListRef *)local_70,deserializer);
    break;
  case 8:
    pp_Var6 = (_func_int **)operator_new(0x68);
    *(undefined1 *)(pp_Var6 + 1) = 8;
    pp_Var6[2] = (_func_int *)(pp_Var6 + 4);
    pp_Var6[3] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var6 + 4) = 0;
    pp_Var6[6] = (_func_int *)0x0;
    pp_Var6[7] = (_func_int *)0xffffffffffffffff;
    pp_Var6[8] = (_func_int *)0x0;
    pp_Var6[9] = (_func_int *)0x0;
    pp_Var6[10] = (_func_int *)0x0;
    pp_Var6[0xb] = (_func_int *)0x0;
    pp_Var6[0xc] = (_func_int *)0x0;
    *pp_Var6 = (_func_int *)&PTR__TableRef_0249b480;
    this->_vptr_TableRef = pp_Var6;
    goto LAB_010c5ef9;
  case 9:
    PivotRef::Deserialize((PivotRef *)local_70,deserializer);
    break;
  case 10:
    ShowRef::Deserialize((ShowRef *)local_70,deserializer);
    break;
  case 0xb:
    ColumnDataRef::Deserialize((ColumnDataRef *)local_70,deserializer);
  }
  uVar1 = local_70._0_8_;
  local_70._0_8_ = (_func_int **)0x0;
  pp_Var6 = this->_vptr_TableRef;
  this->_vptr_TableRef = (_func_int **)uVar1;
  if (pp_Var6 != (_func_int **)0x0) {
    (**(code **)(*pp_Var6 + 8))();
  }
LAB_010c5ef9:
  pTVar7 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      this);
  ::std::__cxx11::string::operator=((string *)&pTVar7->alias,(string *)&local_48);
  pTVar7 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      this);
  auVar2 = local_50;
  local_50 = (undefined1  [8])0x0;
  ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::reset
            ((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             &pTVar7->sample,(pointer)auVar2);
  pTVar7 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      this);
  auVar2 = local_50;
  (pTVar7->query_location).index = (idx_t)pp_Var8;
  if (local_50 != (undefined1  [8])0x0) {
    Value::~Value((Value *)local_50);
    operator_delete((void *)auVar2);
  }
  if ((undefined1 *)local_48 != local_38) {
    operator_delete((void *)local_48);
  }
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> TableRef::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<TableReferenceType>(100, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(101, "alias");
	auto sample = deserializer.ReadPropertyWithDefault<unique_ptr<SampleOptions>>(102, "sample");
	auto query_location = deserializer.ReadPropertyWithExplicitDefault<optional_idx>(103, "query_location", optional_idx());
	unique_ptr<TableRef> result;
	switch (type) {
	case TableReferenceType::BASE_TABLE:
		result = BaseTableRef::Deserialize(deserializer);
		break;
	case TableReferenceType::COLUMN_DATA:
		result = ColumnDataRef::Deserialize(deserializer);
		break;
	case TableReferenceType::EMPTY_FROM:
		result = EmptyTableRef::Deserialize(deserializer);
		break;
	case TableReferenceType::EXPRESSION_LIST:
		result = ExpressionListRef::Deserialize(deserializer);
		break;
	case TableReferenceType::JOIN:
		result = JoinRef::Deserialize(deserializer);
		break;
	case TableReferenceType::PIVOT:
		result = PivotRef::Deserialize(deserializer);
		break;
	case TableReferenceType::SHOW_REF:
		result = ShowRef::Deserialize(deserializer);
		break;
	case TableReferenceType::SUBQUERY:
		result = SubqueryRef::Deserialize(deserializer);
		break;
	case TableReferenceType::TABLE_FUNCTION:
		result = TableFunctionRef::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of TableRef!");
	}
	result->alias = std::move(alias);
	result->sample = std::move(sample);
	result->query_location = query_location;
	return result;
}